

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

ssize_t __thiscall Bstrlib::CBStream::read(CBStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  CBStringException *this_00;
  undefined4 in_register_00000034;
  CBStringException bstr__cppwrapper_exception;
  string local_58;
  CBStringException local_38;
  
  *(undefined4 *)(CONCAT44(in_register_00000034,__fd) + 0xc) = 0;
  do {
    iVar1 = bseof(this->m_s);
    if (iVar1 != 0) {
      return CONCAT44(extraout_var,iVar1);
    }
    iVar1 = bsreada((bstring)(CONCAT44(in_register_00000034,__fd) + 8),this->m_s,0x400);
  } while (-1 < iVar1);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"CBString::Failed read","");
  CBStringException::CBStringException(&local_38,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  this_00 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(this_00,&local_38);
  __cxa_throw(this_00,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

void CBStream::read (CBString& s) {
	s.slen = 0;
	while (!bseof (m_s)) {
		if (0 > bsreada ((bstring) &s, m_s, BS_BUFF_SZ)) {
			bstringThrow ("Failed read");
		}
	}
}